

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O3

Slice * Imf_3_4::Slice::Make
                  (Slice *__return_storage_ptr__,PixelType type,void *ptr,V2i *origin,int64_t w,
                  int64_t h,size_t xStride,size_t yStride,int xSampling,int ySampling,
                  double fillValue,bool xTileCoords,bool yTileCoords)

{
  ArgExc *this;
  stringstream _iex_throw_s;
  ostream local_198 [376];
  
  if (xStride == 0) {
    switch(type) {
    case UINT:
    case FLOAT:
      xStride = 4;
      break;
    case HALF:
      xStride = 2;
      break;
    case NUM_PIXELTYPES:
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"Invalid pixel type.",0x13);
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,(stringstream *)&_iex_throw_s);
      __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    default:
      xStride = 0;
    }
  }
  if (yStride == 0) {
    yStride = (w / (long)xSampling) * xStride;
  }
  Slice(__return_storage_ptr__,type,
        (char *)((long)ptr -
                (((long)origin->y / (long)ySampling) * yStride +
                ((long)origin->x / (long)xSampling) * xStride)),xStride,yStride,xSampling,ySampling,
        fillValue,SUB41(ySampling,0),yTileCoords);
  return __return_storage_ptr__;
}

Assistant:

Slice
Slice::Make (
    PixelType                   type,
    const void*                 ptr,
    const IMATH_NAMESPACE::V2i& origin,
    int64_t                     w,
    int64_t                     h,
    size_t                      xStride,
    size_t                      yStride,
    int                         xSampling,
    int                         ySampling,
    double                      fillValue,
    bool                        xTileCoords,
    bool                        yTileCoords)
{
    intptr_t base = reinterpret_cast<intptr_t> (const_cast<void*> (ptr));
    if (xStride == 0)
    {
        switch (type)
        {
            case UINT: xStride = sizeof (uint32_t); break;
            case HALF: xStride = sizeof (uint16_t); break;
            case FLOAT: xStride = sizeof (float); break;
            case NUM_PIXELTYPES:
                THROW (IEX_NAMESPACE::ArgExc, "Invalid pixel type.");
        }
    }
    if (yStride == 0) yStride = static_cast<size_t> (w / xSampling) * xStride;

    // data window is an int, so force promote to higher type to avoid
    // overflow for off y (degenerate size checks should be in
    // ImfHeader::sanityCheck, but offset can be large-ish)
    int64_t offx =
        (static_cast<int64_t> (origin.x) / static_cast<int64_t> (xSampling));
    offx *= static_cast<int64_t> (xStride);

    int64_t offy =
        (static_cast<int64_t> (origin.y) / static_cast<int64_t> (ySampling));
    offy *= static_cast<int64_t> (yStride);

    return Slice (
        type,
        reinterpret_cast<char*> (base - offx - offy),
        xStride,
        yStride,
        xSampling,
        ySampling,
        fillValue,
        xTileCoords,
        yTileCoords);
}